

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O0

int DispatchAlpha_C(uint8_t *alpha,int alpha_stride,int width,int height,uint8_t *dst,int dst_stride
                   )

{
  byte bVar1;
  uint32_t alpha_value;
  int j;
  int i;
  uint32_t alpha_mask;
  int dst_stride_local;
  uint8_t *dst_local;
  int height_local;
  int width_local;
  int alpha_stride_local;
  uint8_t *alpha_local;
  
  alpha_mask = 0xff;
  dst_local = dst;
  alpha_local = alpha;
  for (j = 0; j < height; j = j + 1) {
    for (i = 0; i < width; i = i + 1) {
      bVar1 = alpha_local[i];
      dst_local[i << 2] = bVar1;
      alpha_mask = bVar1 & alpha_mask;
    }
    alpha_local = alpha_local + alpha_stride;
    dst_local = dst_local + dst_stride;
  }
  return (int)(alpha_mask != 0xff);
}

Assistant:

static int DispatchAlpha_C(const uint8_t* WEBP_RESTRICT alpha, int alpha_stride,
                           int width, int height,
                           uint8_t* WEBP_RESTRICT dst, int dst_stride) {
  uint32_t alpha_mask = 0xff;
  int i, j;

  for (j = 0; j < height; ++j) {
    for (i = 0; i < width; ++i) {
      const uint32_t alpha_value = alpha[i];
      dst[4 * i] = alpha_value;
      alpha_mask &= alpha_value;
    }
    alpha += alpha_stride;
    dst += dst_stride;
  }

  return (alpha_mask != 0xff);
}